

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigUInt.cpp
# Opt level: O2

void __thiscall Js::BigUInt::ShiftRight(BigUInt *this,int32 cbit)

{
  uint *puVar1;
  code *pcVar2;
  sbyte sVar3;
  bool bVar4;
  undefined4 *puVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  
  AssertValid(this,true);
  if (cbit < 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BigUInt.cpp"
                                ,0x11c,"(cbit >= 0)","cbit >= 0");
    if (!bVar4) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  if (0 < cbit >> 5) {
    ShiftLusRight(this,cbit >> 5);
  }
  if (((cbit & 0x1fU) != 0) && (this->m_clu != 0)) {
    puVar1 = this->m_prglu;
    sVar3 = (sbyte)(cbit & 0x1fU);
    uVar7 = *puVar1;
    lVar6 = 1;
    while( true ) {
      uVar8 = uVar7 >> sVar3;
      puVar1[lVar6 + -1] = uVar8;
      if (this->m_clu <= lVar6) break;
      uVar7 = puVar1[lVar6];
      puVar1[lVar6 + -1] = uVar7 << (0x20U - sVar3 & 0x1f) | uVar8;
      lVar6 = lVar6 + 1;
    }
    if (uVar7 >> sVar3 == 0) {
      this->m_clu = this->m_clu + -1;
    }
  }
  AssertValid(this,true);
  return;
}

Assistant:

void BigUInt::ShiftRight(int32 cbit)
    {
        AssertBi(this);
        Assert(cbit >= 0);

        int32 ilu;
        int32 clu = cbit >> 5;
        cbit &= 0x001F;

        if (clu > 0)
            ShiftLusRight(clu);

        if (cbit == 0 || m_clu == 0)
        {
            AssertBi(this);
            return;
        }

        for (ilu = 0; ; )
        {
            m_prglu[ilu] >>= cbit;
            if (++ilu >= m_clu)
            {
            // Last one.
                if (0 == m_prglu[ilu - 1])
                    m_clu--;
                break;
            }
            m_prglu[ilu - 1] |= m_prglu[ilu] << (32 - cbit);
        }

        AssertBi(this);
    }